

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteSubProjects
          (cmGlobalGhsMultiGenerator *this,ostream *fout,string *all_target)

{
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  ostream *poVar4;
  reference ppcVar5;
  string *psVar6;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  string *all_target_local;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  poVar4 = std::operator<<(fout,"CMakeFiles/");
  poVar4 = std::operator<<(poVar4,(string *)all_target);
  poVar4 = std::operator<<(poVar4," [Project]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                     (&this->ProjectTargets);
  target = (cmGeneratorTarget *)
           std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                     (&this->ProjectTargets);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                *)&target);
    if (!bVar1) {
      return;
    }
    ppcVar5 = __gnu_cxx::
              __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    local_40 = *ppcVar5;
    TVar2 = cmGeneratorTarget::GetType(local_40);
    if (((TVar2 != INTERFACE_LIBRARY) &&
        (TVar2 = cmGeneratorTarget::GetType(local_40), TVar2 != MODULE_LIBRARY)) &&
       (TVar2 = cmGeneratorTarget::GetType(local_40), TVar2 != SHARED_LIBRARY)) {
      TVar2 = cmGeneratorTarget::GetType(local_40);
      if (TVar2 == GLOBAL_TARGET) {
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_40);
        iVar3 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x18])();
        bVar1 = std::operator!=(psVar6,(char *)CONCAT44(extraout_var,iVar3));
        if (bVar1) goto LAB_003e8ace;
      }
      poVar4 = std::operator<<(fout,"CMakeFiles/");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_40);
      std::operator+(&local_80,psVar6,".tgt");
      std::operator+(&local_60,&local_80,FILE_EXTENSION);
      poVar4 = std::operator<<(poVar4,(string *)&local_60);
      poVar4 = std::operator<<(poVar4," [Project]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
LAB_003e8ace:
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteSubProjects(std::ostream& fout,
                                                 std::string& all_target)
{
  fout << "CMakeFiles/" << all_target << " [Project]" << std::endl;
  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != GetInstallTargetName())) {
      continue;
    }
    fout << "CMakeFiles/" << target->GetName() + ".tgt" + FILE_EXTENSION
         << " [Project]" << std::endl;
  }
}